

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::ConvolutionParameter::ConvolutionParameter
          (ConvolutionParameter *this,ConvolutionParameter *from)

{
  int iVar1;
  void *pvVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  bool bVar9;
  undefined3 uVar10;
  int32 iVar11;
  bool bVar12;
  undefined3 uVar13;
  uint32 uVar14;
  FillerParameter *pFVar15;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ConvolutionParameter_0071d170;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  (this->pad_).current_size_ = 0;
  *(undefined8 *)&(this->pad_).total_size_ = 0;
  *(undefined4 *)((long)&(this->pad_).rep_ + 4) = 0;
  iVar1 = (from->pad_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->pad_,iVar1);
    memcpy(((this->pad_).rep_)->elements,((from->pad_).rep_)->elements,
           (long)(from->pad_).current_size_ << 2);
    (this->pad_).current_size_ = (from->pad_).current_size_;
  }
  (this->kernel_size_).current_size_ = 0;
  (this->kernel_size_).total_size_ = 0;
  (this->kernel_size_).rep_ = (Rep *)0x0;
  iVar1 = (from->kernel_size_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->kernel_size_,iVar1);
    memcpy(((this->kernel_size_).rep_)->elements,((from->kernel_size_).rep_)->elements,
           (long)(from->kernel_size_).current_size_ << 2);
    (this->kernel_size_).current_size_ = (from->kernel_size_).current_size_;
  }
  (this->stride_).current_size_ = 0;
  (this->stride_).total_size_ = 0;
  (this->stride_).rep_ = (Rep *)0x0;
  iVar1 = (from->stride_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->stride_,iVar1);
    memcpy(((this->stride_).rep_)->elements,((from->stride_).rep_)->elements,
           (long)(from->stride_).current_size_ << 2);
    (this->stride_).current_size_ = (from->stride_).current_size_;
  }
  (this->dilation_).current_size_ = 0;
  (this->dilation_).total_size_ = 0;
  (this->dilation_).rep_ = (Rep *)0x0;
  iVar1 = (from->dilation_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->dilation_,iVar1);
    memcpy(((this->dilation_).rep_)->elements,((from->dilation_).rep_)->elements,
           (long)(from->dilation_).current_size_ << 2);
    (this->dilation_).current_size_ = (from->dilation_).current_size_;
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (((from->_has_bits_).has_bits_[0] & 1) == 0) {
    pFVar15 = (FillerParameter *)0x0;
  }
  else {
    pFVar15 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar15,from->weight_filler_);
  }
  this->weight_filler_ = pFVar15;
  if (((from->_has_bits_).has_bits_[0] & 2) == 0) {
    pFVar15 = (FillerParameter *)0x0;
  }
  else {
    pFVar15 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar15,from->bias_filler_);
  }
  this->bias_filler_ = pFVar15;
  uVar3 = from->pad_h_;
  uVar4 = from->pad_w_;
  uVar5 = from->kernel_h_;
  uVar6 = from->kernel_w_;
  uVar7 = from->stride_h_;
  uVar8 = from->stride_w_;
  iVar1 = from->engine_;
  bVar9 = from->force_nd_im2col_;
  uVar10 = *(undefined3 *)&from->field_0x89;
  iVar11 = from->axis_;
  bVar12 = from->bias_term_;
  uVar13 = *(undefined3 *)&from->field_0x91;
  uVar14 = from->group_;
  this->num_output_ = from->num_output_;
  this->pad_h_ = uVar3;
  this->pad_w_ = uVar4;
  this->kernel_h_ = uVar5;
  this->kernel_w_ = uVar6;
  this->stride_h_ = uVar7;
  this->stride_w_ = uVar8;
  this->engine_ = iVar1;
  this->force_nd_im2col_ = bVar9;
  *(undefined3 *)&this->field_0x89 = uVar10;
  this->axis_ = iVar11;
  this->bias_term_ = bVar12;
  *(undefined3 *)&this->field_0x91 = uVar13;
  this->group_ = uVar14;
  return;
}

Assistant:

ConvolutionParameter::ConvolutionParameter(const ConvolutionParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      pad_(from.pad_),
      kernel_size_(from.kernel_size_),
      stride_(from.stride_),
      dilation_(from.dilation_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weight_filler()) {
    weight_filler_ = new ::caffe::FillerParameter(*from.weight_filler_);
  } else {
    weight_filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  ::memcpy(&num_output_, &from.num_output_,
    reinterpret_cast<char*>(&group_) -
    reinterpret_cast<char*>(&num_output_) + sizeof(group_));
  // @@protoc_insertion_point(copy_constructor:caffe.ConvolutionParameter)
}